

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O3

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<__int128>::Visit
          (PrecomputeVisitor<__int128> *this,shared_ptr<const_calc4::ConditionalOperator> *op)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  shared_ptr<const_calc4::Operator> *psVar3;
  shared_ptr<const_calc4::Operator> ifFalse;
  shared_ptr<const_calc4::Operator> ifTrue;
  shared_ptr<const_calc4::Operator> condition;
  __int128 conditionValue;
  undefined1 local_69;
  shared_ptr<const_calc4::Operator> local_68;
  shared_ptr<const_calc4::Operator> local_58;
  shared_ptr<const_calc4::Operator> local_48;
  long local_38;
  long local_30;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  peVar1 = (((op->super___shared_ptr<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->condition).
           super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**peVar1->_vptr_Operator)(peVar1,this);
  local_48.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_48.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_48.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_48.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar1 = (((op->super___shared_ptr<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->ifTrue).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar1->_vptr_Operator)(peVar1,this);
  local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar1 = (((op->super___shared_ptr<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->ifFalse).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar1->_vptr_Operator)(peVar1,this);
  local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  bVar2 = TryGetPrecomputedValue
                    ((PrecomputeVisitor<__int128> *)
                     local_48.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,(shared_ptr<const_calc4::Operator> *)
                            local_48.
                            super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,(__int128 *)&local_38);
  if (bVar2) {
    psVar3 = &local_58;
    if (local_38 == 0 && local_30 == 0) {
      psVar3 = &local_68;
    }
    (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar3->super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar3 = &local_68;
    if (local_38 != 0 || local_30 != 0) {
      psVar3 = &local_58;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(psVar3->super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
  }
  else {
    std::
    __shared_ptr<calc4::ConditionalOperator::AllocateHelper<calc4::ConditionalOperator>::Object,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<std::allocator<calc4::ConditionalOperator::AllocateHelper<calc4::ConditionalOperator>::Object>,std::shared_ptr<calc4::Operator_const>const&,std::shared_ptr<calc4::Operator_const>const&,std::shared_ptr<calc4::Operator_const>const&>
              ((__shared_ptr<calc4::ConditionalOperator::AllocateHelper<calc4::ConditionalOperator>::Object,(__gnu_cxx::_Lock_policy)2>
                *)&local_28,
               (allocator<calc4::ConditionalOperator::AllocateHelper<calc4::ConditionalOperator>::Object>
                *)&local_69,&local_48,&local_58,&local_68);
    this_00 = (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_28;
    (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Stack_20;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  if (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_48.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const ConditionalOperator>& op) override
    {
        std::shared_ptr<const Operator> condition = Precompute(op->GetCondition());
        std::shared_ptr<const Operator> ifTrue = Precompute(op->GetIfTrue());
        std::shared_ptr<const Operator> ifFalse = Precompute(op->GetIfFalse());

        TNumber conditionValue;
        if (TryGetPrecomputedValue(condition, &conditionValue))
        {
            value = conditionValue != 0 ? ifTrue : ifFalse;
        }
        else
        {
            value = ConditionalOperator::Create(condition, ifTrue, ifFalse);
        }
    }